

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O2

string * __thiscall
hdc::TACBuilderVisitor::newLabel_abi_cxx11_(string *__return_storage_ptr__,TACBuilderVisitor *this)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"L",(allocator *)&local_38);
  std::__cxx11::to_string(&sStack_58,this->labelCounter);
  std::operator+(&local_38,__return_storage_ptr__,&sStack_58);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  this->labelCounter = this->labelCounter + 1;
  return __return_storage_ptr__;
}

Assistant:

std::string TACBuilderVisitor::newLabel() {
    std::string s = "L";
    s = s + std::to_string(labelCounter);
    labelCounter += 1;
    return s;
}